

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_end_deflate(archive *a,la_zstream *lastrm)

{
  void *__ptr;
  int iVar1;
  long in_RSI;
  archive *in_RDI;
  int r;
  z_stream *strm;
  int local_4;
  
  __ptr = *(void **)(in_RSI + 0x48);
  iVar1 = deflateEnd(__ptr);
  free(__ptr);
  *(undefined8 *)(in_RSI + 0x48) = 0;
  *(undefined4 *)(in_RSI + 0x40) = 0;
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    archive_set_error(in_RDI,-1,"Failed to clean up compressor");
    local_4 = -0x1e;
  }
  return local_4;
}

Assistant:

static int
compression_end_deflate(struct archive *a, struct la_zstream *lastrm)
{
	z_stream *strm;
	int r;

	strm = (z_stream *)lastrm->real_stream;
	r = deflateEnd(strm);
	free(strm);
	lastrm->real_stream = NULL;
	lastrm->valid = 0;
	if (r != Z_OK) {
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "Failed to clean up compressor");
		return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}